

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

ssize_t parse_ncname(char *ncname)

{
  LY_ERR LVar1;
  bool bVar2;
  char *local_30;
  ssize_t len;
  size_t size;
  char *pcStack_18;
  uint32_t uc;
  char *ncname_local;
  
  local_30 = (char *)0x0;
  pcStack_18 = ncname;
  LVar1 = ly_getutf8(&stack0xffffffffffffffe8,(uint32_t *)((long)&size + 4),(size_t *)&len);
  if (LVar1 == LY_SUCCESS) {
    if ((((((((((size._4_4_ < 0x61) || (0x7a < size._4_4_)) && (size._4_4_ != 0x5f)) &&
             ((size._4_4_ < 0x41 || (0x5a < size._4_4_)))) &&
            ((size._4_4_ < 0x370 || ((0x1fff < size._4_4_ || (size._4_4_ == 0x37e)))))) &&
           ((size._4_4_ < 0xc0 ||
            (((0x2ff < size._4_4_ || (size._4_4_ == 0xd7)) || (size._4_4_ == 0xf7)))))) &&
          ((((size._4_4_ != 0x200c && (size._4_4_ != 0x200d)) &&
            ((size._4_4_ < 0x2070 || (0x218f < size._4_4_)))) &&
           ((size._4_4_ < 0x2c00 || (0x2fef < size._4_4_)))))) &&
         ((size._4_4_ < 0x3001 || (0xd7ff < size._4_4_)))) &&
        ((((size._4_4_ < 0xf900 || (0xfdcf < size._4_4_)) &&
          ((size._4_4_ < 0xfdf0 || (0xfffd < size._4_4_)))) &&
         ((size._4_4_ < 0x10000 || (0xeffff < size._4_4_)))))) || (size._4_4_ == 0x3a)) {
      ncname_local = (char *)0x0;
    }
    else {
      do {
        local_30 = local_30 + len;
        if (*pcStack_18 == '\0') {
          return (ssize_t)local_30;
        }
        LVar1 = ly_getutf8(&stack0xffffffffffffffe8,(uint32_t *)((long)&size + 4),(size_t *)&len);
        if (LVar1 != LY_SUCCESS) {
          return -(long)local_30;
        }
        if (((((((((0x60 < size._4_4_) && (size._4_4_ < 0x7b)) || (size._4_4_ == 0x5f)) ||
                ((size._4_4_ == 0x2d || ((0x40 < size._4_4_ && (size._4_4_ < 0x5b)))))) ||
               (((0x2f < size._4_4_ && (size._4_4_ < 0x3a)) ||
                (((size._4_4_ == 0x2e || (size._4_4_ == 0xb7)) ||
                 ((0x36f < size._4_4_ && ((size._4_4_ < 0x2000 && (size._4_4_ != 0x37e)))))))))) ||
              ((0xbf < size._4_4_ &&
               (((size._4_4_ < 0x300 && (size._4_4_ != 0xd7)) && (size._4_4_ != 0xf7)))))) ||
             ((((size._4_4_ == 0x200c || (size._4_4_ == 0x200d)) ||
               ((0x2ff < size._4_4_ && (size._4_4_ < 0x370)))) ||
              (((0x206f < size._4_4_ && (size._4_4_ < 0x2190)) ||
               ((0x203e < size._4_4_ && (size._4_4_ < 0x2041)))))))) ||
            (((((0x2bff < size._4_4_ && (size._4_4_ < 0x2ff0)) ||
               ((0x3000 < size._4_4_ && (size._4_4_ < 0xd800)))) ||
              ((0xf8ff < size._4_4_ && (size._4_4_ < 0xfdd0)))) ||
             ((0xfdef < size._4_4_ && (size._4_4_ < 0xfffe)))))) ||
           ((bVar2 = false, 0xffff < size._4_4_ && (bVar2 = false, size._4_4_ < 0xf0000)))) {
          bVar2 = size._4_4_ != 0x3a;
        }
        ncname_local = local_30;
      } while (bVar2);
    }
  }
  else {
    ncname_local = (char *)0x0;
  }
  return (ssize_t)ncname_local;
}

Assistant:

static ssize_t
parse_ncname(const char *ncname)
{
    uint32_t uc;
    size_t size;
    ssize_t len = 0;

    LY_CHECK_RET(ly_getutf8(&ncname, &uc, &size), 0);
    if (!is_xmlqnamestartchar(uc) || (uc == ':')) {
        return len;
    }

    do {
        len += size;
        if (!*ncname) {
            break;
        }
        LY_CHECK_RET(ly_getutf8(&ncname, &uc, &size), -len);
    } while (is_xmlqnamechar(uc) && (uc != ':'));

    return len;
}